

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O1

void injection::InjectionManager::bind_singleton<ITest>(ITest *singleton)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  undefined1 local_10 [8];
  
  local_38._M_unused._M_object = local_10;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<ITest_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/reyesr[P]injection/include/injectionmanager.h:130:35)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<ITest_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/reyesr[P]injection/include/injectionmanager.h:130:35)>
             ::_M_manager;
  bind<ITest>((function<ITest_*()> *)&local_38,SINGLETON_EAGER);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

static void bind_singleton(I* singleton) {
        InjectionManager::bind<I>([&singleton](){return singleton;}, InjectionScope::SINGLETON_EAGER);
    }